

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronMat.cpp
# Opt level: O1

void __thiscall NeuronMat::resetOp(NeuronMat *this)

{
  if (this->op != (Op *)0x0) {
    Op::reset(this->op);
  }
  if (this->op_update != (Op *)0x0) {
    Op::reset(this->op_update);
  }
  if (this->op_reveal != (Op *)0x0) {
    Op::reset(this->op_reveal);
    return;
  }
  return;
}

Assistant:

void NeuronMat::resetOp() {
    if (op != nullptr)
        op->reset();
    if (op_update != nullptr)
        op_update->reset();
    if (op_reveal != nullptr)
        op_reveal->reset();
}